

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::Dump(Instr *this,IRDumpFlags flags)

{
  ushort uVar1;
  undefined2 uVar2;
  IntConstOpnd *pIVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  bool bVar8;
  WORD WVar9;
  uint uVar10;
  uint uVar11;
  uint left;
  int32 iVar12;
  int iVar13;
  JITTimeFunctionBody *pJVar14;
  char16 *pcVar15;
  undefined4 *puVar16;
  MultiBranchInstr *pMVar17;
  ParseableFunctionInfo *pPVar18;
  undefined4 extraout_var;
  _func_int *p_Var19;
  BailOutInfo *pBVar20;
  FunctionJITTimeInfo *pFVar21;
  char *pcVar22;
  ulong uVar23;
  Opnd *pOVar24;
  char16_t *pcVar25;
  uint uVar26;
  ulong uVar27;
  wchar local_a8 [4];
  int32 temp;
  ulong local_50;
  _func_int *local_48;
  Instr *local_40;
  IRDumpFlags local_34;
  
  uVar2 = this->m_opcode;
  if ((ushort)(uVar2 - 0x207) < 2) {
    Output::SkipToColumn(0x17);
    if (this->highlight == 0) {
      WVar9 = 0;
    }
    else {
      WVar9 = Output::SetConsoleForeground(this->highlight);
    }
    pcVar15 = Js::OpCodeUtil::GetOpCodeName(this->m_opcode);
    Output::Print(L"%s ",pcVar15);
    if (this->highlight != 0) {
      Output::SetConsoleForeground(WVar9);
    }
    Output::SkipToColumn(0x26);
    pOVar24 = this->m_src1;
    if (pOVar24 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1183,"(GetSrc1())","GetSrc1()");
      if (!bVar5) goto LAB_004bd194;
      *puVar16 = 0;
      pOVar24 = this->m_src1;
    }
    OVar6 = Opnd::GetKind(pOVar24);
    pOVar24 = this->m_src1;
    if (OVar6 == OpndKindIntConst) {
      OVar6 = Opnd::GetKind(pOVar24);
      if (OVar6 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_004bd194;
        *puVar16 = 0;
      }
      Output::Print(L"%d",pOVar24[1]._vptr_Opnd);
    }
    else {
      Opnd::Dump(pOVar24,flags,this->m_func);
    }
    pIVar3 = (IntConstOpnd *)this->m_dst;
    if (pIVar3 == (IntConstOpnd *)0x0) {
      left = 0;
    }
    else {
      OVar6 = Opnd::GetKind((Opnd *)pIVar3);
      if (OVar6 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_004bd194;
        *puVar16 = 0;
      }
      left = IntConstOpnd::AsInt32(pIVar3);
    }
    if (this->m_src2 == (Opnd *)0x0) {
LAB_004bc872:
      Output::Print(L" %S ","<=");
      uVar26 = left;
      if (left == 0) goto LAB_004bd0b0;
    }
    else {
      OVar6 = Opnd::GetKind(this->m_src2);
      if (OVar6 == OpndKindIntConst) {
        pIVar3 = (IntConstOpnd *)this->m_src2;
        OVar6 = Opnd::GetKind((Opnd *)pIVar3);
        if (OVar6 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar5) goto LAB_004bd194;
          *puVar16 = 0;
        }
        iVar12 = IntConstOpnd::AsInt32(pIVar3);
        bVar5 = Int32Math::Add(left,iVar12,(int32 *)local_a8);
        if (bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x1197,
                             "(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp))"
                             ,
                             "!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp)"
                            );
          if (!bVar5) goto LAB_004bd194;
          *puVar16 = 0;
        }
        pIVar3 = (IntConstOpnd *)this->m_src2;
        OVar6 = Opnd::GetKind((Opnd *)pIVar3);
        if (OVar6 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar5) goto LAB_004bd194;
          *puVar16 = 0;
        }
        iVar12 = IntConstOpnd::AsInt32(pIVar3);
        left = left + iVar12;
        goto LAB_004bc872;
      }
      uVar26 = -left;
      if (left < 0x80000001) {
        uVar26 = left;
      }
      pcVar22 = "<<=";
      if (left == 0xffffffff) {
        pcVar22 = "<<";
      }
      Output::Print(L" %S ",pcVar22 + 1);
      Opnd::Dump(this->m_src2,flags,this->m_func);
      if (uVar26 == 0 || left == 0xffffffff) goto LAB_004bd0b0;
      Output::Print(L" %C ",(ulong)((uint)(0x80000000 < left) * 2 + 0x2b));
    }
    pcVar25 = L"%d";
  }
  else {
    Output::SkipToColumn(4);
    if (this->m_dst != (Opnd *)0x0) {
      Opnd::Dump(this->m_dst,flags,this->m_func);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,MarkTempPhase,uVar10,uVar11);
      bVar8 = true;
      if (bVar5) {
LAB_004bc4fe:
        bVar5 = true;
        if ((this->field_0x36 & 6) != 0) {
          Output::Print(L"[");
LAB_004bc517:
          if ((DAT_015bc46a != '\0') ||
             (bVar5 = OpCodeAttr::TempNumberProducing(this->m_opcode), bVar5)) {
            uVar1 = *(ushort *)&this->field_0x36;
            if ((uVar1 & 4) == 0) {
              if ((uVar1 & 2) == 0) goto LAB_004bca8c;
              pcVar15 = L"#";
            }
            else {
              if ((uVar1 & 2) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar16 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                                   ,0x11d6,"(this->dstIsTempNumber)","this->dstIsTempNumber");
                if (!bVar5) goto LAB_004bd194;
                *puVar16 = 0;
              }
              pcVar15 = L"x";
            }
            Output::Print(pcVar15);
          }
LAB_004bca8c:
          if (bVar8 != false) goto LAB_004bca91;
          goto LAB_004bcac4;
        }
LAB_004bcb30:
        if (bVar8 != false) goto LAB_004bcb35;
      }
      else {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MarkTempPhase,uVar10,uVar11);
        bVar8 = true;
        if (bVar5) goto LAB_004bc4fe;
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,MarkTempNumberPhase,uVar10,uVar11);
        bVar7 = true;
        if (!bVar5) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
          pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MarkTempNumberPhase,uVar10,uVar11);
        }
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,MarkTempObjectPhase,uVar10,uVar11);
        if (!bVar5) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
          pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
          bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MarkTempObjectPhase,uVar10,uVar11);
          if (bVar7 != false) goto LAB_004bc4fe;
          bVar5 = false;
          goto LAB_004bcb30;
        }
        bVar8 = true;
        if (bVar7 != false) goto LAB_004bc4fe;
        bVar5 = false;
LAB_004bcb35:
        if ((this->field_0x36 & 8) != 0) {
          Output::Print(L"[");
          bVar8 = true;
          if (bVar5) goto LAB_004bc517;
LAB_004bca91:
          if (((DAT_015bc46a != '\0') ||
              (bVar5 = OpCodeAttr::TempObjectProducing(this->m_opcode), bVar5)) &&
             ((this->field_0x36 & 8) != 0)) {
            Output::Print(L"o");
          }
LAB_004bcac4:
          Output::Print(L"tmp]");
        }
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->topFunc->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,TrackNegativeZeroPhase,uVar10,uVar11);
      if ((bVar5) && ((this->field_0x36 & 0x40) != 0)) {
        Output::Print(L"[-0]");
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->topFunc->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,TypedArrayVirtualPhase,uVar10,uVar11);
      if (bVar5) {
        if ((*(ushort *)&this->field_0x36 >> 0xe & 1) == 0) {
          if (-1 < (short)*(ushort *)&this->field_0x36) goto LAB_004bcc2b;
          pcVar25 = L"[->n]";
        }
        else {
          pcVar25 = L"[->i]";
        }
        Output::Print(pcVar25);
      }
LAB_004bcc2b:
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar21 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->topFunc->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar21);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,TrackIntOverflowPhase,uVar10,uVar11);
      if ((bVar5) && ((*(ushort *)&this->field_0x36 & 0x180) != 0)) {
        if (this->ignoreOverflowBitCount == ' ') {
          Output::Print(L"[OF]");
        }
        else {
          Output::Print(L"[OF %d]");
        }
      }
      bVar5 = (this->field_0x38 & 0x20) == 0;
      pcVar25 = L"<==";
      if (bVar5) {
        pcVar25 = L"=";
      }
      Output::SkipToColumn((ulong)bVar5 + 0x13);
      Output::Print(pcVar25);
    }
    Output::SkipToColumn(0x17);
    if (this->highlight == 0) {
      WVar9 = 0;
    }
    else {
      WVar9 = Output::SetConsoleForeground(this->highlight);
    }
    pcVar15 = Js::OpCodeUtil::GetOpCodeName(this->m_opcode);
    Output::Print(L"%s ",pcVar15);
    if (this->highlight != 0) {
      Output::SetConsoleForeground(WVar9);
    }
    Output::SkipToColumn(0x26);
    if (this->m_kind == InstrKindBranch) {
      if (this[1].m_next == (Instr *)0x0) {
        if (*(char *)((long)&this[1]._vptr_Instr + 1) == '\x01') {
          pMVar17 = BranchInstr::AsMultiBrInstr((BranchInstr *)this);
          if (this->m_opcode != MultiBr) goto LAB_004bcdd0;
          MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(pMVar17);
        }
        else {
          Output::Print(L"??");
        }
      }
      else {
        Output::Print(L"$L%d",(ulong)*(uint *)((long)&this[1].m_next[1].m_func + 4));
      }
      if (this->m_src1 != (Opnd *)0x0) {
        Output::Print(L", ");
      }
    }
    else if ((this->m_kind == InstrKindPragma) && (this->m_opcode == StatementBoundary)) {
      Output::Print(L"#%d",(ulong)*(uint *)&this[1]._vptr_Instr);
    }
LAB_004bcdd0:
    pOVar24 = this->m_src1;
    if ((this->m_opcode & ~ExtendedOpcodePrefix) == NewScFunc) {
      OVar6 = Opnd::GetKind(pOVar24);
      if (OVar6 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x1245,"(src1->IsIntConstOpnd())","src1->IsIntConstOpnd()");
        if (!bVar5) goto LAB_004bd194;
        *puVar16 = 0;
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pPVar18 = (ParseableFunctionInfo *)JITTimeFunctionBody::GetAddr(pJVar14);
      OVar6 = Opnd::GetKind(pOVar24);
      if (OVar6 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_004bd194;
        *puVar16 = 0;
      }
      pPVar18 = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                          (pPVar18,*(uint *)&pOVar24[1]._vptr_Opnd);
      pPVar18 = Js::FunctionProxy::GetParseableFunctionInfo(&pPVar18->super_FunctionProxy);
      if (pPVar18 == (ParseableFunctionInfo *)0x0) {
        pcVar25 = L"???";
      }
      else {
        iVar13 = (*(pPVar18->super_FunctionProxy).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar18);
        pcVar25 = (char16_t *)CONCAT44(extraout_var,iVar13);
      }
      Output::Print(L"func:%s()",pcVar25);
      Output::Print(L", env:");
      pOVar24 = this->m_src2;
      OVar6 = Opnd::GetKind(pOVar24);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_004bd194:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar16 = 0;
      }
      Sym::Dump((Sym *)pOVar24[1]._vptr_Opnd,flags,(ValueType)0x9);
    }
    else if (pOVar24 != (Opnd *)0x0) {
      Opnd::Dump(pOVar24,flags,this->m_func);
      pOVar24 = this->m_src2;
      if (pOVar24 != (Opnd *)0x0) {
        Output::Print(L", ");
        Opnd::Dump(pOVar24,flags,this->m_func);
      }
    }
    if (this->m_opcode != SpeculatedLoadFence &&
        (this->m_opcode != ByteCodeUses || this->m_kind != InstrKindByteCodeUses))
    goto LAB_004bd0b0;
    local_40 = this;
    local_34 = flags;
    if ((this[1]._vptr_Instr != (_func_int **)0x0) &&
       (p_Var19 = *this[1]._vptr_Instr, p_Var19 != (_func_int *)0x0)) {
      bVar5 = true;
      do {
        uVar23 = *(ulong *)(p_Var19 + 0x10);
        local_48 = p_Var19;
        if (uVar23 != 0) {
          local_50 = (ulong)*(uint *)(p_Var19 + 8);
          uVar27 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          pcVar25 = L", s%d";
          if (bVar5) {
            pcVar25 = L"s%d";
          }
          do {
            iVar13 = (int)local_50;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar27);
            uVar23 = uVar23 & ~(1L << (uVar27 & 0x3f));
            bVar5 = false;
            Output::Print(pcVar25,(ulong)(iVar13 + (BVIndex)uVar27));
            pcVar25 = L", s%d";
            uVar27 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
          } while (uVar23 != 0);
        }
        p_Var19 = *(_func_int **)local_48;
      } while (p_Var19 != (_func_int *)0x0);
    }
    this = local_40;
    flags = local_34;
    if (*(long *)&local_40[1].m_noLazyHelperAssert == 0) goto LAB_004bd0b0;
    uVar26 = *(uint *)(*(long *)&local_40[1].m_noLazyHelperAssert + 0x10);
    pcVar25 = L"  PropSym: %d";
  }
  Output::Print(pcVar25,(ulong)uVar26);
LAB_004bd0b0:
  if ((flags & (IRDumpFlags_SkipByteCodeOffset|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    DumpByteCodeOffset(this);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) && ((this->field_0x38 & 0x50) != 0)) {
    pBVar20 = GetBailOutInfo(this);
    Output::SkipToColumn(0x55);
    if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
      Output::Print(L"Bailout: #%04x",(ulong)pBVar20->bailOutOffset);
    }
    if (pBVar20->bailOutFunc->parentFunc != (Func *)0x0) {
      pFVar21 = JITTimeWorkItem::GetJITTimeInfo(pBVar20->bailOutFunc->m_workItem);
      pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar21,(wchar (*) [42])local_a8);
      Output::Print(L" Func %s",pcVar15);
    }
    pcVar22 = GetBailOutKindName(this);
    Output::Print(L" (%S)",pcVar22);
  }
  if ((flags & IRDumpFlags_SkipEndLine) == IRDumpFlags_None) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
Instr::Dump(IRDumpFlags flags)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    bool const SkipByteCodeOffset = !!(flags & IRDumpFlags_SkipByteCodeOffset);

    const auto PrintOpCodeName = [&]() {
        Output::SkipToColumn(23);
#if DBG
        WORD oldValue = 0;
        if (this->highlight != 0)
        {
            oldValue = Output::SetConsoleForeground(this->highlight);
        }
#endif
        Output::Print(_u("%s "), Js::OpCodeUtil::GetOpCodeName(m_opcode));
#if DBG
        if (this->highlight != 0)
        {
            Output::SetConsoleForeground(oldValue);
        }
#endif
        Output::SkipToColumn(38);
    };

    // forward decl before goto statement
    Opnd * dst = nullptr;

    if(m_opcode == Js::OpCode::BoundCheck || m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        PrintOpCodeName();

        // src1 <= src2 + dst

        Assert(GetSrc1());
        if(GetSrc1()->IsIntConstOpnd())
        {
            Output::Print(_u("%d"), GetSrc1()->AsIntConstOpnd()->GetValue());
        }
        else
        {
            GetSrc1()->Dump(flags, m_func);
        }

        bool useLessThanOrEqual = true;
        bool usePlus = true;
        bool dumpSrc2 = false;
        int32 offset = GetDst() ? GetDst()->AsIntConstOpnd()->AsInt32() : 0;
        if(GetSrc2())
        {
            if(GetSrc2()->IsIntConstOpnd())
            {
            #if DBG
                int32 temp;
                Assert(!Int32Math::Add(offset, GetSrc2()->AsIntConstOpnd()->AsInt32(), &temp));
            #endif
                offset += GetSrc2()->AsIntConstOpnd()->AsInt32();
            }
            else
            {
                dumpSrc2 = true;
                if(offset == -1)
                {
                    useLessThanOrEqual = false; // < instead of <=
                    offset = 0;
                }
                else if(offset < 0 && offset != IntConstMin)
                {
                    usePlus = false;
                    offset = -offset;
                }
            }
        }

        Output::Print(_u(" %S "), useLessThanOrEqual ? "<=" : "<");
        if(dumpSrc2)
        {
            GetSrc2()->Dump(flags, m_func);
        }
        if(offset != 0)
        {
            if(dumpSrc2)
            {
                Output::Print(_u(" %C "), usePlus ? '+' : '-');
            }
            Output::Print(_u("%d"), offset);
        }

        goto PrintByteCodeOffsetEtc;
    }

    Output::SkipToColumn(4);

    dst = this->GetDst();

    if (dst)
    {
        dst->Dump(flags, this->m_func);

        bool const dumpMarkTemp = PHASE_DUMP(Js::MarkTempPhase, m_func)
            || PHASE_TRACE(Js::MarkTempPhase, m_func);
        bool const dumpMarkTempNumber = dumpMarkTemp || PHASE_DUMP(Js::MarkTempNumberPhase, m_func)
            || PHASE_TRACE(Js::MarkTempNumberPhase, m_func);
        bool const dumpMarkTempObject = dumpMarkTemp || PHASE_DUMP(Js::MarkTempObjectPhase, m_func)
            || PHASE_TRACE(Js::MarkTempObjectPhase, m_func);

        if ((dumpMarkTempNumber && (this->dstIsTempNumberTransferred || this->dstIsTempNumber))
            || (dumpMarkTempObject && this->dstIsTempObject))
        {
            Output::Print(_u("["));

            if (dumpMarkTempNumber)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempNumberProducing(this->m_opcode))
                {
                    if (this->dstIsTempNumberTransferred)
                    {
                        Assert(this->dstIsTempNumber);
                        Output::Print(_u("x"));
                    }
                    else if (this->dstIsTempNumber)
                    {
                        Output::Print(_u("#"));
                    }
                }
            }
            if (dumpMarkTempObject)
            {
                if (Js::Configuration::Global.flags.Verbose || OpCodeAttr::TempObjectProducing(this->m_opcode))
                {
                    if (this->dstIsTempObject)
                    {
                        Output::Print(_u("o"));
                    }
                }
            }

            Output::Print(_u("tmp]"));
        }
        if(PHASE_DUMP(Js::TrackNegativeZeroPhase, m_func->GetTopFunc()) && !ShouldCheckForNegativeZero())
        {
            Output::Print(_u("[-0]"));
        }
        if (PHASE_DUMP(Js::TypedArrayVirtualPhase, m_func->GetTopFunc()) && (!IsDstNotAlwaysConvertedToInt32() || !IsDstNotAlwaysConvertedToNumber()))
        {
            if (!IsDstNotAlwaysConvertedToInt32())
                Output::Print(_u("[->i]"));
            else
                Output::Print(_u("[->n]"));

        }
        if(PHASE_DUMP(Js::TrackIntOverflowPhase, m_func->GetTopFunc()))
        {
            // ignoring 32-bit overflow ?
            if(!ShouldCheckFor32BitOverflow())
            {
                // ignoring 32-bits or more ?
                if(ShouldCheckForNon32BitOverflow())
                    Output::Print(_u("[OF %d]"), ignoreOverflowBitCount);
                else
                    Output::Print(_u("[OF]"));
            }
        }

        if (this->isSafeToSpeculate)
        {
            Output::SkipToColumn(19);
            Output::Print(_u("<=="));
        }
        else
        {
            Output::SkipToColumn(20);
            Output::Print(_u("="));
        }
    }

    PrintOpCodeName();

    if (this->IsBranchInstr())
    {
        BranchInstr * branchInstr = this->AsBranchInstr();
        LabelInstr * targetInstr = branchInstr->GetTarget();
        bool labelPrinted = true;
        if (targetInstr == NULL)
        {
            // Checking the 'm_isMultiBranch' field here directly as well to bypass asserting when tracing IR builder
            if(branchInstr->m_isMultiBranch && branchInstr->IsMultiBranch())
            {
                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                // If this MultiBranchInstr has been lowered to a machine instruction, which means
                // its opcode is not Js::OpCode::MultiBr, there is no need to print the labels.
                if (this->m_opcode == Js::OpCode::MultiBr)
                {
                    multiBranchInstr->MapMultiBrLabels([](IR::LabelInstr * labelInstr) -> void
                    {
                        Output::Print(_u("$L%d "), labelInstr->m_id);
                    });
                }
                else
                {
                    labelPrinted = false;
                }
            }
            else
            {
                Output::Print(_u("??"));
            }
        }
        else
        {
            Output::Print(_u("$L%d"), targetInstr->m_id);
        }
        if (this->GetSrc1() && labelPrinted)
        {
            Output::Print(_u(", "));
        }
    }
    else if (this->IsPragmaInstr() && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Output::Print(_u("#%d"), this->AsPragmaInstr()->m_statementIndex);
    }

    // scope
    {
        Opnd * src1 = this->GetSrc1();
        if (this->m_opcode == Js::OpCode::NewScFunc || this->m_opcode == Js::OpCode::NewScGenFunc)
        {
            Assert(src1->IsIntConstOpnd());
            Js::ParseableFunctionInfo * function = nullptr;
            if (!m_func->IsOOPJIT())
            {
                function = ((Js::ParseableFunctionInfo *)m_func->GetJITFunctionBody()->GetAddr())->GetNestedFunctionForExecution((uint)src1->AsIntConstOpnd()->GetValue())->GetParseableFunctionInfo();
            }
            Output::Print(_u("func:%s()"), function ? function->GetDisplayName() : _u("???"));
            Output::Print(_u(", env:"));
            this->GetSrc2()->AsRegOpnd()->m_sym->Dump(flags);
        }
        else if (src1)
        {
            src1->Dump(flags, this->m_func);
            Opnd * src2 = this->GetSrc2();
            if (src2)
            {
                Output::Print(_u(", "));
                src2->Dump(flags, this->m_func);
            }
        }
    }

    if (this->IsByteCodeUsesInstr() || this->m_opcode == Js::OpCode::SpeculatedLoadFence)
    {
        ByteCodeUsesInstr* tempbcu = static_cast<ByteCodeUsesInstr*>(this);
        if (tempbcu->GetByteCodeUpwardExposedUsed())
        {
            bool first = true;
            FOREACH_BITSET_IN_SPARSEBV(id, tempbcu->GetByteCodeUpwardExposedUsed())
            {
                Output::Print(first? _u("s%d") : _u(", s%d"), id);
                first = false;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        if (tempbcu->propertySymUse)
        {
            Output::Print(_u("  PropSym: %d"), tempbcu->propertySymUse->m_id);
        }
    }

PrintByteCodeOffsetEtc:
    if (!AsmDumpMode && !SkipByteCodeOffset)
    {
        this->DumpByteCodeOffset();
    }

    if (!SimpleForm)
    {
        if (this->HasBailOutInfo() || this->HasAuxBailOut())
        {
            BailOutInfo * bailOutInfo = this->GetBailOutInfo();
            Output::SkipToColumn(85);
            if (!AsmDumpMode)
            {
                Output::Print(_u("Bailout: #%04x"), bailOutInfo->bailOutOffset);
            }
            if (!bailOutInfo->bailOutFunc->IsTopFunc())
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u(" Func %s"), bailOutInfo->bailOutFunc->GetDebugNumberSet(debugStringBuffer));
            }
            Output::Print(_u(" (%S)"), this->GetBailOutKindName());
        }
    }
    if ((flags & IRDumpFlags_SkipEndLine) == 0)
    {
        Output::Print(_u("\n"));
    }
}